

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall
soul::heart::Parser::scanBlocks(Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  pointer pBVar1;
  bool bVar2;
  Block *pBVar3;
  Module *this_00;
  Identifier *extraout_RDX;
  Identifier *extraout_RDX_00;
  Identifier *args;
  pointer pBVar4;
  Identifier name;
  CodeLocation paramLocation;
  Identifier paramName;
  Type paramType;
  Identifier local_c0;
  Role local_b4;
  CodeLocation local_b0;
  Block *local_a0;
  vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
  *local_98;
  FunctionParseState *local_90;
  FunctionBuilder *local_88;
  pool_ptr<soul::Module> *local_80;
  pool_ref<soul::heart::Variable> local_78;
  Identifier local_70;
  undefined1 local_68 [56];
  
  local_98 = &state->blocks;
  local_80 = &this->module;
  local_90 = state;
  local_88 = builder;
  do {
    local_c0 = parseBlockName(this);
    pBVar1 = (state->blocks).
             super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    args = extraout_RDX;
    for (pBVar4 = (state->blocks).
                  super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
                  ._M_impl.super__Vector_impl_data._M_start; pBVar4 != pBVar1; pBVar4 = pBVar4 + 1)
    {
      if ((pBVar4->block->name).name == local_c0.name) {
        Errors::nameInUse<soul::Identifier&>((CompileMessage *)local_68,(Errors *)&local_c0,args);
        (*(this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser[2])(this,(CompileMessage *)local_68);
        CompileMessage::~CompileMessage((CompileMessage *)local_68);
        args = extraout_RDX_00;
      }
    }
    pBVar3 = FunctionBuilder::createBlock(local_88,local_c0);
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x29b537);
    if (bVar2) {
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x299119);
      if (!bVar2) {
        local_a0 = pBVar3;
        while( true ) {
          readValueOrRefType((Type *)local_68,this);
          local_b0.sourceCode.object =
               (this->
               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ).location.sourceCode.object;
          if (local_b0.sourceCode.object != (SourceCodeText *)0x0) {
            ((local_b0.sourceCode.object)->super_RefCountedObject).refCount =
                 ((local_b0.sourceCode.object)->super_RefCountedObject).refCount + 1;
          }
          local_b0.location.data =
               (this->
               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ).location.location.data;
          local_70 = parseVariableIdentifier(this);
          this_00 = pool_ptr<soul::Module>::operator->(local_80);
          local_b4 = parameter;
          local_78.object =
               Module::
               allocate<soul::heart::Variable,soul::CodeLocation,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
                         (this_00,&local_b0,(Type *)local_68,&local_70,&local_b4);
          std::
          vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
          ::emplace_back<soul::pool_ref<soul::heart::Variable>>
                    ((vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
                      *)&pBVar3->parameters,&local_78);
          bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ::matchIf<soul::TokenType>
                            (&this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                             ,(TokenType)0x275d9e);
          if (!bVar2) break;
          RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_b0.sourceCode);
          RefCountedPtr<soul::Structure>::~RefCountedPtr
                    ((RefCountedPtr<soul::Structure> *)(local_68 + 0x10));
        }
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,(TokenType)0x299119);
        RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_b0.sourceCode);
        RefCountedPtr<soul::Structure>::~RefCountedPtr
                  ((RefCountedPtr<soul::Structure> *)(local_68 + 0x10));
        pBVar3 = local_a0;
      }
    }
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x275274);
    local_68._8_8_ =
         (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.location.data;
    local_68._0_8_ = pBVar3;
    std::
    vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
    ::emplace_back<soul::FunctionParseState::BlockCode>(local_98,(BlockCode *)local_68);
    state = local_90;
    while( true ) {
      skipPastNextOccurrenceOf(this,(TokenType)0x2743e3);
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matches(&this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ,(TokenType)0x275ba8);
      if (bVar2) break;
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x2748be);
      if (bVar2) {
        return;
      }
    }
  } while( true );
}

Assistant:

void scanBlocks (FunctionParseState& state, FunctionBuilder& builder)
    {
        for (;;)
        {
            auto name = parseBlockName();

            for (auto& b : state.blocks)
                if (b.block.name == name)
                    throwError (Errors::nameInUse (name));

            auto& block = builder.createBlock (name);

            if (matchIf (HEARTOperator::openParen))
            {
                if (! matchIf (HEARTOperator::closeParen))
                {
                    for (;;)
                    {
                        auto paramType = readValueOrRefType();
                        auto paramLocation = location;
                        auto paramName = parseVariableIdentifier();
                        block.parameters.push_back (module->allocate<heart::Variable> (std::move (paramLocation), paramType, paramName, heart::Variable::Role::parameter));

                        if (matchIf (HEARTOperator::comma))
                            continue;

                        expect (HEARTOperator::closeParen);
                        break;
                    }
                }
            }

            expect (HEARTOperator::colon);
            state.blocks.push_back ({ block, getCurrentTokeniserPosition() });

            skipPastNextOccurrenceOf (HEARTOperator::semicolon);

            while (! matches (Token::blockIdentifier))
            {
                if (matchIf (HEARTOperator::closeBrace))
                    return;

                skipPastNextOccurrenceOf (HEARTOperator::semicolon);
            }
        }
    }